

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

int __thiscall QUrlQueryPrivate::findRecodedKey(QUrlQueryPrivate *this,QString *key,int from)

{
  long lVar1;
  char16_t *pcVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  qsizetype *pqVar8;
  QStringView rhs;
  QStringView lhs;
  
  lVar1 = (this->itemList).d.size;
  lVar6 = (long)from;
  bVar4 = lVar6 < lVar1;
  if (lVar6 < lVar1) {
    pcVar2 = (key->d).ptr;
    lVar3 = (key->d).size;
    pqVar8 = &(this->itemList).d.ptr[lVar6].first.d.size;
    do {
      if (*pqVar8 == lVar3) {
        rhs.m_data = pcVar2;
        rhs.m_size = lVar3;
        lhs.m_data = (char16_t *)pqVar8[-1];
        lhs.m_size = *pqVar8;
        bVar5 = QtPrivate::equalStrings(lhs,rhs);
        if (bVar5) break;
      }
      lVar6 = lVar6 + 1;
      from = from + 1;
      pqVar8 = pqVar8 + 6;
      bVar4 = lVar6 < lVar1;
    } while (lVar6 < lVar1);
  }
  iVar7 = (int)lVar1;
  if (bVar4) {
    iVar7 = from;
  }
  return iVar7;
}

Assistant:

int findRecodedKey(const QString &key, int from = 0) const
    {
        for (int i = from; i < itemList.size(); ++i)
            if (itemList.at(i).first == key)
                return i;
        return itemList.size();
    }